

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void CheckConfig(Abc_TgMan_t *pMan)

{
  int iVar1;
  char local_28 [8];
  char pPermE [16];
  int i;
  Abc_TgMan_t *pMan_local;
  
  Abc_TgExpendSymmetry(pMan,local_28);
  pPermE[0xc] = '\0';
  pPermE[0xd] = '\0';
  pPermE[0xe] = '\0';
  pPermE[0xf] = '\0';
  while( true ) {
    if (pMan->nVars <= (int)pPermE._12_4_) {
      iVar1 = Abc_TgCannonVerify(pMan);
      if (iVar1 != 0) {
        return;
      }
      __assert_fail("Abc_TgCannonVerify(pMan)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x677,"void CheckConfig(Abc_TgMan_t *)");
    }
    if (local_28[(int)pPermE._12_4_] != pMan->pPermT[(int)pPermE._12_4_]) break;
    if ((int)pMan->pPermTRev[(int)pMan->pPermT[(int)pPermE._12_4_]] != pPermE._12_4_) {
      __assert_fail("pMan->pPermTRev[(int)pMan->pPermT[i]] == i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x675,"void CheckConfig(Abc_TgMan_t *)");
    }
    pPermE._12_4_ = pPermE._12_4_ + 1;
  }
  __assert_fail("pPermE[i] == pMan->pPermT[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                ,0x674,"void CheckConfig(Abc_TgMan_t *)");
}

Assistant:

static void CheckConfig(Abc_TgMan_t * pMan)
{
#ifndef NDEBUG
    int i;
    char pPermE[16];
    Abc_TgExpendSymmetry(pMan, pPermE);
    for (i = 0; i < pMan->nVars; i++)
    {
        assert(pPermE[i] == pMan->pPermT[i]);
        assert(pMan->pPermTRev[(int)pMan->pPermT[i]] == i);
    }
    assert(Abc_TgCannonVerify(pMan));
#endif
}